

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O1

int per_binding(hash_key_t key,hash_data_t data,void *opaque)

{
  internal_binding_t *piVar1;
  int iVar2;
  
  if (2 < debug_level) {
    per_binding_cold_1();
  }
  while (piVar1 = ((internal_binding_t *)data)->next_binding, piVar1 != (internal_binding_t *)0x0) {
    data = piVar1;
    if (2 < debug_level) {
      per_binding_cold_2();
    }
  }
  iVar2 = prepare_symbol((internal_binding_t *)data);
  if (iVar2 == -1) {
    if (2 < debug_level) {
      per_binding_cold_3();
    }
  }
  else {
    removefrom_hashtable(&notfound_binding_table,key);
  }
  return 0;
}

Assistant:

static int per_binding(hash_key_t key, hash_data_t data, void *opaque KNOWN_UNUSED)
{
   int result;
   struct internal_binding_t *binding = (struct internal_binding_t *) data;

   debug_printf(3, "Trying to re-bind %s from tool %s after dlopen\n",
                binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   
   while (binding->next_binding) {
      binding = binding->next_binding;
      debug_printf(3, "Selecting new innermost version of binding %s from tool %s.\n",
                   binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   }
   
   result = prepare_symbol(binding);
   if (result == -1) {
      debug_printf(3, "Still could not prepare binding %s after dlopen\n", binding->user_binding->name);
      return 0;
   }

   removefrom_hashtable(&notfound_binding_table, key);
   return 0;
}